

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O0

void absl::lts_20250127::debugging_internal::anon_unknown_0::DumpPCAndFrameSize
               (OutputWriter *writer,void *writer_arg,void *pc,int framesize,char *prefix)

{
  char local_98 [8];
  char buf [100];
  char *prefix_local;
  int framesize_local;
  void *pc_local;
  void *writer_arg_local;
  OutputWriter *writer_local;
  
  unique0x1000007f = prefix;
  if (framesize < 1) {
    snprintf(local_98,100,"%s@ %*p  (unknown)\n",prefix,0x12,pc);
  }
  else {
    snprintf(local_98,100,"%s@ %*p  %9d\n",prefix,0x12,pc,framesize);
  }
  (*writer)(local_98,writer_arg);
  return;
}

Assistant:

void DumpPCAndFrameSize(OutputWriter* writer, void* writer_arg, void* const pc,
                        int framesize, const char* const prefix) {
  char buf[100];
  if (framesize <= 0) {
    snprintf(buf, sizeof(buf), "%s@ %*p  (unknown)\n", prefix,
             kPrintfPointerFieldWidth, pc);
  } else {
    snprintf(buf, sizeof(buf), "%s@ %*p  %9d\n", prefix,
             kPrintfPointerFieldWidth, pc, framesize);
  }
  writer(buf, writer_arg);
}